

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O2

int xSAT_SolverAddClause(xSAT_Solver_t *s,Vec_Int_t *vLits)

{
  char cVar1;
  uint Entry;
  int iVar2;
  uint uVar3;
  size_t __nmemb;
  int i;
  
  __nmemb = (size_t)vLits->nSize;
  qsort(vLits->pArray,__nmemb,4,Vec_IntSortCompare1);
  if ((long)vLits->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar2 = vLits->pArray[(long)vLits->nSize + -1];
  while (s->vActivity->nSize <= iVar2 >> 1) {
    xSAT_SolverAddVariable(s,(int)__nmemb);
  }
  uVar3 = 0xfffffffe;
  iVar2 = 0;
  for (i = 0; i < vLits->nSize; i = i + 1) {
    Entry = Vec_IntEntry(vLits,i);
    if ((Entry ^ uVar3) == 1) goto LAB_0046744c;
    cVar1 = Vec_StrEntry(s->vAssigns,(int)Entry >> 1);
    if ((Entry & 1) == (int)cVar1) goto LAB_0046744c;
    if (Entry != uVar3) {
      cVar1 = Vec_StrEntry(s->vAssigns,(int)Entry >> 1);
      if (cVar1 == '\x03') {
        Vec_IntWriteEntry(vLits,iVar2,Entry);
        uVar3 = Entry;
        iVar2 = iVar2 + 1;
      }
    }
  }
  Vec_IntShrink(vLits,iVar2);
  uVar3 = vLits->nSize;
  if (uVar3 != 0) {
    if (uVar3 == 1) {
      iVar2 = Vec_IntEntry(vLits,0);
      xSAT_SolverEnqueue(s,iVar2,0xffffffff);
      uVar3 = xSAT_SolverPropagate(s);
      uVar3 = (uint)(uVar3 == 0xffffffff);
    }
    else {
      xSAT_SolverClaNew(s,vLits,0);
LAB_0046744c:
      uVar3 = 1;
    }
  }
  return uVar3;
}

Assistant:

int xSAT_SolverAddClause( xSAT_Solver_t * s, Vec_Int_t * vLits )
{
    int i, j;
    int Lit, PrevLit;
    int MaxVar;

    Vec_IntSort( vLits, 0 );
    MaxVar = xSAT_Lit2Var( Vec_IntEntryLast( vLits ) );
    while ( MaxVar >= Vec_IntSize( s->vActivity ) )
        xSAT_SolverAddVariable( s, 1 );

    j = 0;
    PrevLit = LitUndef;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        if ( Lit == xSAT_NegLit( PrevLit ) || Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == xSAT_LitSign( Lit ) )
            return true;
        else if ( Lit != PrevLit && Vec_StrEntry( s->vAssigns, xSAT_Lit2Var( Lit ) ) == VarX )
        {
            PrevLit = Lit;
            Vec_IntWriteEntry( vLits, j++, Lit );
        }
    }
    Vec_IntShrink( vLits, j );

    if ( Vec_IntSize( vLits ) == 0 )
        return false;
    if ( Vec_IntSize( vLits ) == 1 )
    {
        xSAT_SolverEnqueue( s, Vec_IntEntry( vLits, 0 ), CRefUndef );
        return ( xSAT_SolverPropagate( s ) == CRefUndef );
    }

    xSAT_SolverClaNew( s, vLits, 0 );
    return true;
}